

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::_::
CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::$_0>
::operator()(CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>
             *this,unsigned_long *args)

{
  Timer *pTVar1;
  unsigned_long *args_00;
  bool bVar2;
  Type *pTVar3;
  NoInfer<unsigned_long> *in_RDX;
  Type functor;
  undefined1 local_38 [8];
  Type localFunctor;
  unsigned_long *args_local;
  CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>
  *this_local;
  
  bVar2 = Maybe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:544:10)>
          ::operator==();
  if (bVar2) {
    throwMultipleCoCaptureInvocations();
  }
  pTVar3 = readMaybe<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>
                     ((Maybe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>
                       *)args);
  pTVar3 = mv<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>
                     (pTVar3);
  local_38 = (undefined1  [8])pTVar3->timer;
  localFunctor.timer = (Timer *)pTVar3->i;
  Maybe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:544:10)>
  ::operator=((Maybe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>
               *)args);
  pTVar3 = mv<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>
                     ((Type *)local_38);
  pTVar1 = pTVar3->timer;
  args_00 = (unsigned_long *)pTVar3->i;
  fwd<unsigned_long>(in_RDX);
  functor.i = (size_t)pTVar1;
  functor.timer = (Timer *)this;
  CaptureForCoroutine<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:544:10)>
  ::coInvoke<unsigned_long>(functor,args_00);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

auto operator()(Args&&... args) {
    if (maybeFunctor == kj::none) {
      throwMultipleCoCaptureInvocations();
    }
    auto localFunctor = kj::mv(*kj::_::readMaybe(maybeFunctor));
    maybeFunctor = kj::none;
    return coInvoke(kj::mv(localFunctor), kj::fwd<Args>(args)...);
  }